

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O1

Odc_Lit_t Odc_And(Odc_Man_t *p,Odc_Lit_t iFan0,Odc_Lit_t iFan1)

{
  Vec_Int_t *pVVar1;
  Odc_Obj_t *pOVar2;
  ulong uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  int *piVar7;
  int iVar8;
  Odc_Lit_t *pOVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  if (iFan0 == iFan1) {
    return iFan0;
  }
  if ((iFan1 ^ iFan0) == 1) {
    return 1;
  }
  if (iFan0 < 2) {
    if (iFan0 != 0) {
      return 1;
    }
    return iFan1;
  }
  if (iFan1 < 2) {
    if (iFan1 != 0) {
      return 1;
    }
    return iFan0;
  }
  uVar13 = (uint)iFan1;
  if (iFan1 < iFan0) {
    uVar13 = (uint)iFan0;
  }
  uVar12 = (uint)iFan1;
  if (iFan0 < iFan1) {
    uVar12 = (uint)iFan0;
  }
  uVar4 = (ushort)uVar12;
  uVar10 = (ushort)uVar13;
  if (uVar10 <= uVar4) {
    __assert_fail("iFan0 < iFan1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcOdc.c"
                  ,0x21a,"Odc_Lit_t *Odc_HashLookup(Odc_Man_t *, Odc_Lit_t, Odc_Lit_t)");
  }
  uVar11 = 0x38f;
  if ((uVar12 & 1) == 0) {
    uVar11 = 0;
  }
  uVar6 = 0x161;
  if ((uVar13 & 1) == 0) {
    uVar6 = 0;
  }
  uVar3 = (ulong)(uVar6 ^ uVar11 ^ (uVar12 & 0xfffe) * 0x1f01 ^ (uVar13 & 0xfffe) * 0xb9b) %
          (ulong)(uint)p->nTableSize;
  if (p->pTable[uVar3] != 0) goto LAB_0088650f;
  pVVar1 = p->vUsedSpots;
  uVar11 = pVVar1->nCap;
  if (pVVar1->nSize == uVar11) {
    if ((int)uVar11 < 0x10) {
      if (pVVar1->pArray == (int *)0x0) {
        piVar7 = (int *)malloc(0x40);
      }
      else {
        piVar7 = (int *)realloc(pVVar1->pArray,0x40);
      }
      pVVar1->pArray = piVar7;
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar11 * 2;
      if (iVar8 <= (int)uVar11) goto LAB_008864fd;
      if (pVVar1->pArray == (int *)0x0) {
        piVar7 = (int *)malloc((ulong)uVar11 << 3);
      }
      else {
        piVar7 = (int *)realloc(pVVar1->pArray,(ulong)uVar11 << 3);
      }
      pVVar1->pArray = piVar7;
    }
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar1->nCap = iVar8;
  }
LAB_008864fd:
  iVar8 = pVVar1->nSize;
  pVVar1->nSize = iVar8 + 1;
  pVVar1->pArray[iVar8] = (int)uVar3;
LAB_0088650f:
  pOVar9 = p->pTable + uVar3;
  for (uVar5 = *pOVar9; uVar5 != 0; uVar5 = pOVar2[uVar5].iNext) {
    if (((uVar5 & 1) != 0) || (uVar5 = uVar5 >> 1, p->nObjs <= (int)(uint)uVar5)) goto LAB_0088660d;
    pOVar2 = p->pObjs;
    if ((pOVar2[uVar5].iFan0 == uVar4) && (pOVar2[uVar5].iFan1 == uVar10)) break;
    pOVar9 = &pOVar2[uVar5].iNext;
  }
  uVar5 = *pOVar9;
  if (uVar5 == 0) {
    iVar8 = p->nObjs;
    if (p->nObjsAlloc <= iVar8) {
      __assert_fail("p->nObjs < p->nObjsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcOdc.c"
                    ,0x77,"Odc_Obj_t *Odc_ObjNew(Odc_Man_t *)");
    }
    pOVar2 = p->pObjs;
    p->nObjs = iVar8 + 1;
    pOVar2[iVar8].iFan0 = uVar4;
    pOVar2[iVar8].iFan1 = uVar10;
    pOVar2[iVar8].iNext = 0;
    pOVar2[iVar8].TravId = 0;
    uVar12 = (uVar12 & 0xfffe) >> 1;
    if ((iVar8 < (int)uVar12) || (uVar13 = (uVar13 & 0xfffe) >> 1, iVar8 < (int)uVar13)) {
LAB_0088660d:
      __assert_fail("!(Lit & 1) && (int)(Lit>>1) < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcOdc.c"
                    ,0x79,"Odc_Obj_t *Odc_Lit2Obj(Odc_Man_t *, Odc_Lit_t)");
    }
    pOVar2[iVar8].uMask =
         *(uint *)((long)&pOVar2->uMask + (ulong)(uVar13 << 4)) |
         *(uint *)((long)&pOVar2->uMask + (ulong)(uVar12 << 4));
    uVar5 = (short)iVar8 * 2;
    *pOVar9 = uVar5;
  }
  return uVar5;
}

Assistant:

static inline Odc_Lit_t Odc_And( Odc_Man_t * p, Odc_Lit_t iFan0, Odc_Lit_t iFan1 )
{
    Odc_Obj_t * pObj;
    Odc_Lit_t * pEntry;
    unsigned uMask0, uMask1;
    int Temp;
    // consider trivial cases
    if ( iFan0 == iFan1 )
        return iFan0;
    if ( iFan0 == Odc_Not(iFan1) )
        return Odc_Const0();
    if ( Odc_Regular(iFan0) == Odc_Const1() )
        return iFan0 == Odc_Const1() ? iFan1 : Odc_Const0();
    if ( Odc_Regular(iFan1) == Odc_Const1() )
        return iFan1 == Odc_Const1() ? iFan0 : Odc_Const0();
    // canonicize the fanin order
    if ( iFan0 > iFan1 )
        Temp = iFan0, iFan0 = iFan1, iFan1 = Temp;
    // check if a node with these fanins exists
    pEntry = Odc_HashLookup( p, iFan0, iFan1 );
    if ( *pEntry )
        return *pEntry;
    // create a new node
    pObj = Odc_ObjNew( p );
    pObj->iFan0 = iFan0;
    pObj->iFan1 = iFan1;
    pObj->iNext = 0;
    pObj->TravId = 0;
    // set the mask
    uMask0 = Odc_Lit2Obj(p, Odc_Regular(iFan0))->uMask;
    uMask1 = Odc_Lit2Obj(p, Odc_Regular(iFan1))->uMask;
    pObj->uMask = uMask0 | uMask1;
    // add to the table
    *pEntry = Odc_Obj2Lit( p, pObj );
    return *pEntry;
}